

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::get_hash_for_descriptor_set_layout
          (StateRecorder *this,VkDescriptorSetLayout layout,Hash *hash)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false> local_30;
  iterator itr;
  Hash *hash_local;
  VkDescriptorSetLayout layout_local;
  StateRecorder *this_local;
  
  if (layout == (VkDescriptorSetLayout)0x0) {
    *hash = 0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>.
    _M_cur = (_Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>)
             (_Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>)
             hash;
    hash_local = (Hash *)layout;
    layout_local = (VkDescriptorSetLayout)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkDescriptorSetLayout_T_*,_unsigned_long,_std::hash<VkDescriptorSetLayout_T_*>,_std::equal_to<VkDescriptorSetLayout_T_*>,_std::allocator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>_>_>
         ::find(&this->impl->descriptor_set_layout_to_hash,(key_type *)&hash_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkDescriptorSetLayout_T*,unsigned_long,std::hash<VkDescriptorSetLayout_T*>,std::equal_to<VkDescriptorSetLayout_T*>,std::allocator<std::pair<VkDescriptorSetLayout_T*const,unsigned_long>>>>
                   (&this->impl->descriptor_set_layout_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      log_failed_hash<VkDescriptorSetLayout_T*>
                ("Descriptor set layout",(VkDescriptorSetLayout_T *)hash_local);
      this_local._7_1_ = false;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false,_false>
               ::operator->((_Node_iterator<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false,_false>
                             *)&local_30);
      *(unsigned_long *)
       itr.
       super__Node_iterator_base<std::pair<VkDescriptorSetLayout_T_*const,_unsigned_long>,_false>.
       _M_cur = ppVar2->second;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::get_hash_for_descriptor_set_layout(VkDescriptorSetLayout layout, Hash *hash) const
{
	if (layout == VK_NULL_HANDLE)
	{
		// Allowed by VK_EXT_graphics_pipeline_library.
		*hash = 0;
		return true;
	}

	auto itr = impl->descriptor_set_layout_to_hash.find(layout);
	if (itr == end(impl->descriptor_set_layout_to_hash))
	{
		log_failed_hash("Descriptor set layout", layout);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}